

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::HMPImporter::CanRead(HMPImporter *this,string *pFile,IOSystem *pIOHandler,bool cs)

{
  bool bVar1;
  bool bVar2;
  string extension;
  uint32_t tokens [3];
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"hmp");
  bVar2 = true;
  if (!bVar1) {
    if (extension._M_string_length == 0 || cs) {
      tokens[0] = 0x34504d48;
      tokens[1] = 0x35504d48;
      tokens[2] = 0x37504d48;
      bVar2 = BaseImporter::CheckMagicToken(pIOHandler,pFile,tokens,3,0,4);
    }
    else {
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool HMPImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool cs) const
{
    const std::string extension = GetExtension(pFile);
    if (extension == "hmp" )
        return true;

    // if check for extension is not enough, check for the magic tokens
    if (!extension.length() || cs) {
        uint32_t tokens[3];
        tokens[0] = AI_HMP_MAGIC_NUMBER_LE_4;
        tokens[1] = AI_HMP_MAGIC_NUMBER_LE_5;
        tokens[2] = AI_HMP_MAGIC_NUMBER_LE_7;
        return CheckMagicToken(pIOHandler,pFile,tokens,3,0);
    }
    return false;
}